

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoapySDRProbe.cpp
# Opt level: O0

undefined8 channelSensorReadings_abi_cxx11_(Device *device,int dir,size_t chan)

{
  Range *pRVar1;
  reference pvVar2;
  ostream *poVar3;
  ulong uVar4;
  undefined8 in_RCX;
  undefined4 in_EDX;
  long *in_RSI;
  undefined8 in_RDI;
  double dVar5;
  double dVar6;
  string reading;
  ArgInfo info;
  string key;
  size_t i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sensors;
  stringstream ss;
  ostream *in_stack_fffffffffffffc50;
  ostream *in_stack_fffffffffffffc60;
  string local_348 [32];
  string local_328 [32];
  string local_308 [32];
  undefined1 local_2e8 [64];
  string local_2a8 [32];
  string local_288 [32];
  string local_268 [40];
  Range local_240 [72];
  string local_1f8 [32];
  Range *pRVar7;
  Range *range;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe38;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c0;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  undefined8 local_20;
  undefined4 local_14;
  long *local_10;
  
  local_20 = in_RCX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  std::__cxx11::stringstream::stringstream(local_1a8);
  (**(code **)(*local_10 + 0x2d0))(&local_1c0,local_10,local_14,local_20);
  pRVar7 = (Range *)0x0;
  while( true ) {
    range = pRVar7;
    pRVar1 = (Range *)std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::size(&local_1c0);
    if (pRVar1 <= pRVar7) break;
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&local_1c0,(size_type)range);
    std::__cxx11::string::string(local_1f8,(string *)pvVar2);
    (**(code **)(*local_10 + 0x2d8))(local_2e8,local_10,local_14,local_20,local_1f8);
    (**(code **)(*local_10 + 0x2e0))(local_308,local_10,local_14,local_20,local_1f8);
    poVar3 = std::operator<<(local_198,"     * ");
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&local_1c0,(size_type)range);
    std::operator<<(poVar3,(string *)pvVar2);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      poVar3 = std::operator<<(local_198," (");
      poVar3 = std::operator<<(poVar3,local_2a8);
      std::operator<<(poVar3,")");
    }
    std::operator<<(local_198,":");
    dVar5 = SoapySDR::Range::maximum(local_240);
    dVar6 = std::numeric_limits<double>::min();
    if (dVar6 < dVar5) {
      toString_abi_cxx11_(range);
      std::operator<<(local_198,local_328);
      std::__cxx11::string::~string(local_328);
    }
    toString<std::__cxx11::string>(in_stack_fffffffffffffe38);
    std::operator<<(local_198,local_348);
    std::__cxx11::string::~string(local_348);
    poVar3 = std::operator<<(local_198," ");
    std::operator<<(poVar3,local_308);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      in_stack_fffffffffffffc60 = std::operator<<(local_198," ");
      std::operator<<(in_stack_fffffffffffffc60,local_268);
    }
    std::ostream::operator<<(local_198,std::endl<char,std::char_traits<char>>);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      poVar3 = std::operator<<(local_198,"        ");
      in_stack_fffffffffffffc50 = std::operator<<(poVar3,local_288);
      std::ostream::operator<<(in_stack_fffffffffffffc50,std::endl<char,std::char_traits<char>>);
    }
    std::__cxx11::string::~string(local_308);
    SoapySDR::ArgInfo::~ArgInfo((ArgInfo *)in_stack_fffffffffffffc50);
    std::__cxx11::string::~string(local_1f8);
    pRVar7 = range + 1;
  }
  std::__cxx11::stringstream::str();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffc60);
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return in_RDI;
}

Assistant:

std::string channelSensorReadings(SoapySDR::Device *device, const int dir, const size_t chan)
{
    std::stringstream ss;

    /*******************************************************************
     * Channel sensor readings
     ******************************************************************/
    std::vector<std::string> sensors = device->listSensors(dir, chan);

    for (size_t i = 0; i < sensors.size(); i++)
    {
        std::string key = sensors[i];
        SoapySDR::ArgInfo info = device->getSensorInfo(dir, chan, key);
        std::string reading = device->readSensor(dir, chan, key);

        ss << "     * " << sensors[i];
        if (not info.name.empty()) ss << " (" << info.name << ")";
        ss << ":";
        if (info.range.maximum() > std::numeric_limits<double>::min()) ss << toString(info.range);
        ss << toString(info.options);
        ss << " " << reading;
        if (not info.units.empty()) ss << " " << info.units;
        ss << std::endl;
        if (not info.description.empty()) ss << "        " << info.description << std::endl;
    }

    return ss.str();
}